

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

long ply_set_read_cb(p_ply ply,char *element_name,char *property_name,p_ply_read_cb read_cb,
                    void *pdata,long idata)

{
  long lVar1;
  uint uVar2;
  p_ply_element ptVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  uVar2 = (uint)ply->nelements;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = 0;
  }
  ptVar3 = ply->element;
  lVar4 = 0;
  do {
    lVar8 = lVar4;
    if (uVar7 * 0x118 + 0x118 == lVar8 + 0x118) {
      return 0;
    }
    iVar5 = strcmp(ptVar3->name + lVar8,element_name);
    lVar4 = lVar8 + 0x118;
  } while (iVar5 != 0);
  uVar7 = 0;
  if (ptVar3 != (p_ply_element)0x0) {
    uVar2 = *(uint *)((long)&ptVar3->nproperties + lVar8);
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar7;
    }
    lVar4 = *(long *)((long)&ptVar3->property + lVar8);
    lVar9 = 0;
    do {
      lVar1 = lVar9 + 0x128;
      if (uVar6 * 0x128 + 0x128 == lVar1) goto LAB_0013ee8d;
      iVar5 = strcmp((char *)(lVar9 + lVar4),property_name);
      lVar9 = lVar1;
    } while (iVar5 != 0);
    if (lVar4 == 0) {
LAB_0013ee8d:
      uVar7 = 0;
    }
    else {
      *(p_ply_read_cb *)(lVar4 + -0x18 + lVar1) = read_cb;
      *(void **)(lVar4 + -0x10 + lVar1) = pdata;
      *(long *)(lVar4 + -8 + lVar1) = idata;
      uVar7 = (ulong)*(int *)((long)&ptVar3->ninstances + lVar8);
    }
  }
  return uVar7;
}

Assistant:

long ply_set_read_cb(p_ply ply, const char *element_name,
        const char* property_name, p_ply_read_cb read_cb,
        void *pdata, long idata) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && element_name && property_name);
    element = ply_find_element(ply, element_name);
    if (!element) return 0;
    property = ply_find_property(element, property_name);
    if (!property) return 0;
    property->read_cb = read_cb;
    property->pdata = pdata;
    property->idata = idata;
    return (int) element->ninstances;
}